

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

void __thiscall IMLE::clusterInverseSolutions(IMLE *this,int newSol1,int newSol2,int worseSol)

{
  undefined8 *puVar1;
  double *pdVar2;
  double dVar3;
  pointer pFVar4;
  pointer piVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  double dVar8;
  int iVar9;
  undefined1 *puVar10;
  undefined8 *puVar11;
  long lVar12;
  Index IVar13;
  pointer pMVar14;
  undefined1 *puVar15;
  double *pdVar16;
  undefined4 in_register_00000034;
  long lVar17;
  pointer pMVar18;
  long lVar19;
  double *pdVar20;
  ulong uVar21;
  Index index;
  long lVar22;
  Index index_1;
  long lVar23;
  Index j;
  long lVar24;
  Index othersize;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *__s;
  double dVar25;
  Mat p;
  Z dist;
  Mat sol;
  ArrayZZ sum_invRp;
  scalar_sum_op<double,_double> local_149;
  DenseStorage<double,__1,__1,__1,_0> local_148;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_128;
  DenseStorage<double,__1,__1,__1,_0> local_118;
  double local_100;
  int local_f4;
  long local_f0;
  IMLE *local_e8;
  plainobjectbase_evaluator_data<double,_0> local_e0;
  long local_d8;
  long local_d0;
  vector<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_c8;
  undefined1 local_b0 [16];
  product_evaluator<Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
  local_a0;
  DenseStorage<double,__1,__1,__1,_0> *local_88;
  undefined8 local_80;
  long local_78;
  double *local_70;
  undefined1 local_68 [16];
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *local_58;
  DenseStorage<double,__1,__1,__1,_0> *local_50;
  variable_if_dynamic<long,__1> local_48;
  variable_if_dynamic<long,__1> local_40;
  pointer local_38;
  
  local_148.m_data = (double *)0x0;
  local_148.m_rows = 0;
  local_148.m_cols = 0;
  lVar22 = (long)this->M;
  lVar12 = (long)this->nInvSolFound;
  if ((lVar12 != 0 && lVar22 != 0) &&
     (auVar6 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar6 / SEXT816(lVar12),0) < lVar22)) {
    puVar11 = (undefined8 *)
              __cxa_allocate_exception
                        (8,CONCAT44(in_register_00000034,newSol1),SUB168(auVar6 % SEXT816(lVar12),0)
                        );
    *puVar11 = operator_delete;
    __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_148,lVar12 * lVar22,lVar22,lVar12);
  local_118.m_data = (double *)0x0;
  local_118.m_rows = 0;
  local_118.m_cols = 0;
  lVar22 = (long)this->d;
  lVar12 = (long)this->nInvSolFound;
  if ((lVar12 != 0 && lVar22 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar12),0) < lVar22)) {
    puVar11 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar11 = operator_delete;
    __cxa_throw(puVar11,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize(&local_118,lVar12 * lVar22,lVar22,lVar12);
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::vector(&local_c8,(long)this->nInvSolFound,&this->zeroZZ,(allocator_type *)local_b0);
  if (1 < this->nInvSolFound) {
    lVar12 = 0;
    lVar22 = 0;
    do {
      pMVar14 = (pointer)local_118.m_rows;
      if ((((ulong)(local_118.m_data + local_118.m_rows * lVar22) & 7) == 0) &&
         (pMVar14 = (pointer)(ulong)((uint)((ulong)(local_118.m_data + local_118.m_rows * lVar22) >>
                                           3) & 1), local_118.m_rows <= (long)pMVar14)) {
        pMVar14 = (pointer)local_118.m_rows;
      }
      lVar24 = (long)(this->invPredictions).
                     super__Vector_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[lVar22].
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
      ;
      if (0 < (long)pMVar14) {
        pMVar18 = (pointer)0x0;
        do {
          *(undefined8 *)((long)local_118.m_data + (long)pMVar18 * 8 + local_118.m_rows * lVar12) =
               *(undefined8 *)(lVar24 + (long)pMVar18 * 8);
          pMVar18 = (pointer)((long)&(pMVar18->
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     ).m_storage.m_data + 1);
        } while (pMVar14 != pMVar18);
      }
      lVar23 = local_118.m_rows - (long)pMVar14;
      pMVar18 = (pointer)((long)&(pMVar14->
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                                 m_storage.m_data +
                         (lVar23 - (lVar23 >> 0x3f) & 0xfffffffffffffffeU));
      if (1 < lVar23) {
        do {
          puVar11 = (undefined8 *)(lVar24 + (long)pMVar14 * 8);
          uVar7 = puVar11[1];
          puVar1 = (undefined8 *)
                   ((long)local_118.m_data + (long)pMVar14 * 8 + local_118.m_rows * lVar12);
          *puVar1 = *puVar11;
          puVar1[1] = uVar7;
          pMVar14 = (pointer)((long)&(pMVar14->
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     ).m_storage.m_data + 2);
        } while ((long)pMVar14 < (long)pMVar18);
      }
      if ((long)pMVar18 < local_118.m_rows) {
        do {
          *(undefined8 *)((long)local_118.m_data + (long)pMVar18 * 8 + local_118.m_rows * lVar12) =
               *(undefined8 *)(lVar24 + (long)pMVar18 * 8);
          pMVar18 = (pointer)((long)&(pMVar18->
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     ).m_storage.m_data + 1);
        } while ((pointer)local_118.m_rows != pMVar18);
      }
      lVar22 = lVar22 + 1;
      lVar12 = lVar12 + 8;
    } while (lVar22 < (long)this->nInvSolFound + -1);
  }
  pdVar20 = local_118.m_data + worseSol * local_118.m_rows;
  pMVar14 = (pointer)local_118.m_rows;
  if ((((ulong)pdVar20 & 7) == 0) &&
     (pMVar14 = (pointer)(ulong)((uint)((ulong)pdVar20 >> 3) & 1), local_118.m_rows <= (long)pMVar14
     )) {
    pMVar14 = (pointer)local_118.m_rows;
  }
  lVar12 = *(long *)&(this->experts).
                     super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                     .
                     super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                     ._M_impl.super__Vector_impl_data._M_start[newSol1].super_LinearExpert.pred_z.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
  lVar22 = local_118.m_rows - (long)pMVar14;
  if (0 < (long)pMVar14) {
    pMVar18 = (pointer)0x0;
    do {
      pdVar20[(long)pMVar18] = *(double *)(lVar12 + (long)pMVar18 * 8);
      pMVar18 = (pointer)((long)&(pMVar18->
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                                 m_storage.m_data + 1);
    } while (pMVar14 != pMVar18);
  }
  pMVar18 = (pointer)((long)&(pMVar14->
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                             m_storage.m_data + (lVar22 - (lVar22 >> 0x3f) & 0xfffffffffffffffeU));
  if (1 < lVar22) {
    do {
      pdVar16 = (double *)(lVar12 + (long)pMVar14 * 8);
      dVar25 = pdVar16[1];
      pdVar20[(long)pMVar14] = *pdVar16;
      (pdVar20 + (long)pMVar14)[1] = dVar25;
      pMVar14 = (pointer)((long)&(pMVar14->
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                                 m_storage.m_data + 2);
    } while ((long)pMVar14 < (long)pMVar18);
  }
  if ((long)pMVar18 < local_118.m_rows) {
    do {
      pdVar20[(long)pMVar18] = *(double *)(lVar12 + (long)pMVar18 * 8);
      pMVar18 = (pointer)((long)&(pMVar18->
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                                 m_storage.m_data + 1);
    } while ((pointer)local_118.m_rows != pMVar18);
  }
  pdVar20 = local_118.m_data + ((long)this->nInvSolFound + -1) * local_118.m_rows;
  pMVar14 = (pointer)local_118.m_rows;
  if ((((ulong)pdVar20 & 7) == 0) &&
     (pMVar14 = (pointer)(ulong)((uint)((ulong)pdVar20 >> 3) & 1), local_118.m_rows <= (long)pMVar14
     )) {
    pMVar14 = (pointer)local_118.m_rows;
  }
  lVar12 = *(long *)&(this->experts).
                     super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                     .
                     super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                     ._M_impl.super__Vector_impl_data._M_start[newSol2].super_LinearExpert.pred_z.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>;
  lVar22 = local_118.m_rows - (long)pMVar14;
  if (0 < (long)pMVar14) {
    pMVar18 = (pointer)0x0;
    do {
      pdVar20[(long)pMVar18] = *(double *)(lVar12 + (long)pMVar18 * 8);
      pMVar18 = (pointer)((long)&(pMVar18->
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                                 m_storage.m_data + 1);
    } while (pMVar14 != pMVar18);
  }
  pMVar18 = (pointer)((long)&(pMVar14->
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                             m_storage.m_data + (lVar22 - (lVar22 >> 0x3f) & 0xfffffffffffffffeU));
  if (1 < lVar22) {
    do {
      pdVar16 = (double *)(lVar12 + (long)pMVar14 * 8);
      dVar25 = pdVar16[1];
      pdVar20[(long)pMVar14] = *pdVar16;
      (pdVar20 + (long)pMVar14)[1] = dVar25;
      pMVar14 = (pointer)((long)&(pMVar14->
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                                 m_storage.m_data + 2);
    } while ((long)pMVar14 < (long)pMVar18);
  }
  if ((long)pMVar18 < local_118.m_rows) {
    do {
      pdVar20[(long)pMVar18] = *(double *)(lVar12 + (long)pMVar18 * 8);
      pMVar18 = (pointer)((long)&(pMVar18->
                                 super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                                 m_storage.m_data + 1);
    } while ((pointer)local_118.m_rows != pMVar18);
  }
  if (0 < (this->param).iterMax) {
    local_e0.data = (double *)&this->invRzj;
    iVar9 = 0;
    local_e8 = this;
    do {
      local_f4 = iVar9;
      if (0 < this->M) {
        lVar12 = 0;
        lVar22 = 0;
        do {
          lVar24 = lVar22;
          local_f0 = lVar12;
          if (0 < this->nInvSolFound) {
            local_d0 = lVar22 * 0x308;
            lVar23 = 0;
            lVar12 = 0;
            local_d8 = lVar22;
            do {
              IVar13 = local_118.m_rows;
              pdVar20 = local_118.m_data;
              pFVar4 = (this->experts).
                       super_vector<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                       .
                       super__Vector_base<FastLinearExpert,_Eigen::aligned_allocator_indirection<FastLinearExpert>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              local_128.m_storage.m_data = (double *)0x0;
              local_128.m_storage.m_rows = 0;
              Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                        (&local_128,local_118.m_rows,1);
              lVar17 = *(long *)((long)&(pFVar4->super_LinearExpert).pred_z + local_d0);
              if (local_128.m_storage.m_rows != IVar13) {
                Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
                          (&local_128,IVar13,1);
              }
              lVar24 = local_d8;
              this = local_e8;
              pMVar14 = (pointer)(local_128.m_storage.m_rows - (local_128.m_storage.m_rows >> 0x3f)
                                 & 0xfffffffffffffffe);
              if (1 < local_128.m_storage.m_rows) {
                lVar19 = 0;
                do {
                  pdVar16 = (double *)(lVar17 + lVar19 * 8);
                  dVar25 = pdVar16[1];
                  pdVar2 = (double *)((long)pdVar20 + lVar19 * 8 + IVar13 * lVar23);
                  dVar3 = pdVar2[1];
                  local_128.m_storage.m_data[lVar19] = *pdVar16 - *pdVar2;
                  (local_128.m_storage.m_data + lVar19)[1] = dVar25 - dVar3;
                  lVar19 = lVar19 + 2;
                } while (lVar19 < (long)pMVar14);
              }
              if ((long)pMVar14 < local_128.m_storage.m_rows) {
                do {
                  local_128.m_storage.m_data[(long)pMVar14] =
                       *(double *)(lVar17 + (long)pMVar14 * 8) -
                       *(double *)((long)pdVar20 + (long)pMVar14 * 8 + IVar13 * lVar23);
                  pMVar14 = (pointer)((long)&(pMVar14->
                                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                             ).m_storage.m_data + 1);
                } while ((pointer)local_128.m_storage.m_rows != pMVar14);
              }
              local_68._8_8_ =
                   (local_e8->iInvRj).
                   super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + lVar22;
              local_68._0_8_ = &local_128;
              dVar25 = -0.0;
              local_58 = (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_68._0_8_;
              if ((((pointer)local_68._8_8_)->
                  super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows
                  != 0) {
                local_b0._8_8_ = local_128.m_storage.m_data;
                Eigen::internal::
                product_evaluator<Eigen::Product<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>,_7,_Eigen::DenseShape,_Eigen::DenseShape,_double,_double>
                ::product_evaluator(&local_a0,(XprType *)(local_68 + 8));
                local_100 = Eigen::internal::
                            redux_impl<Eigen::internal::scalar_sum_op<double,double>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,-1,1,0,-1,1>const,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Matrix<double,-1,1,0,-1,1>,0>const>>,3,0>
                            ::
                            run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::Product<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,1,0,_1,1>,0>const>>
                                      ((redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>_>
                                        *)local_b0,&local_149,
                                       (CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0>_>
                                        *)local_68);
                free(local_a0.m_result.
                     super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data
                    );
                dVar25 = local_100 * -0.5;
              }
              dVar25 = exp(dVar25 / this->sumAll);
              local_148.m_data[local_148.m_rows * lVar12 + lVar24] = dVar25;
              free(local_128.m_storage.m_data);
              lVar12 = lVar12 + 1;
              lVar23 = lVar23 + 8;
            } while (lVar12 < this->nInvSolFound);
          }
          if (local_148.m_cols == 0) {
            dVar25 = 0.0;
          }
          else {
            dVar25 = local_148.m_data[lVar24];
            if (1 < local_148.m_cols) {
              lVar12 = local_148.m_cols + -1;
              pdVar20 = (double *)(local_f0 + local_148.m_rows * 8 + (long)local_148.m_data);
              do {
                dVar25 = dVar25 + *pdVar20;
                pdVar20 = pdVar20 + local_148.m_rows;
                lVar12 = lVar12 + -1;
              } while (lVar12 != 0);
            }
          }
          if ((0.0 < dVar25) && (0 < local_148.m_cols)) {
            pdVar20 = (double *)((long)local_148.m_data + local_f0);
            IVar13 = local_148.m_cols;
            do {
              *pdVar20 = *pdVar20 / dVar25;
              pdVar20 = pdVar20 + local_148.m_rows;
              IVar13 = IVar13 + -1;
            } while (IVar13 != 0);
          }
          if (0 < this->nInvSolFound) {
            lVar12 = 0;
            do {
              dVar25 = local_148.m_data[local_148.m_rows * lVar12 + lVar24];
              lVar23 = (long)(this->iInvRj).
                             super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                             ._M_impl.super__Vector_impl_data._M_start[lVar22].
                             super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                             m_storage.m_data;
              pdVar20 = local_c8.
                        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[lVar12].
                        super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                        m_data;
              lVar17 = local_c8.
                       super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[lVar12].
                       super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
                       m_cols * local_c8.
                                super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                ._M_impl.super__Vector_impl_data._M_start[lVar12].
                                super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                                m_storage.m_rows;
              uVar21 = lVar17 - (lVar17 >> 0x3f) & 0xfffffffffffffffe;
              if (1 < lVar17) {
                lVar19 = 0;
                do {
                  pdVar16 = (double *)(lVar23 + lVar19 * 8);
                  dVar8 = pdVar16[1];
                  dVar3 = (pdVar20 + lVar19)[1];
                  pdVar20[lVar19] = *pdVar16 * dVar25 + pdVar20[lVar19];
                  (pdVar20 + lVar19)[1] = dVar8 * dVar25 + dVar3;
                  lVar19 = lVar19 + 2;
                } while (lVar19 < (long)uVar21);
              }
              if ((long)uVar21 < lVar17) {
                do {
                  pdVar20[uVar21] = *(double *)(lVar23 + uVar21 * 8) * dVar25 + pdVar20[uVar21];
                  uVar21 = uVar21 + 1;
                } while (lVar17 - uVar21 != 0);
              }
              lVar12 = lVar12 + 1;
            } while (lVar12 < this->nInvSolFound);
          }
          lVar22 = lVar24 + 1;
          lVar12 = local_f0 + 8;
        } while (lVar22 < this->M);
      }
      if (0 < this->nInvSolFound) {
        dVar25 = 0.0;
        lVar12 = 0;
        do {
          IVar13 = local_118.m_rows;
          local_a0.super_evaluator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          super_evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>.m_d.data
               = (evaluator<Eigen::PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>)
                 (local_148.m_data + local_148.m_rows * lVar12);
          local_b0._0_8_ =
               (long)&((local_c8.
                        super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->
                      super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
                      m_data + (long)dVar25;
          local_b0._8_8_ = local_e0.data;
          local_a0.m_result.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
          .m_data = (double *)local_148.m_rows;
          local_88 = &local_148;
          local_80 = 0;
          local_70 = (double *)local_148.m_rows;
          __s = (PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
                (local_118.m_data + local_118.m_rows * lVar12);
          local_68._8_8_ = local_118.m_rows;
          local_50 = &local_118;
          local_48.m_value = 0;
          local_38 = (pointer)local_118.m_rows;
          pMVar14 = (pointer)local_118.m_rows;
          if ((((ulong)__s & 7) == 0) &&
             (pMVar14 = (pointer)(ulong)((uint)((ulong)__s >> 3) & 1),
             local_118.m_rows <= (long)pMVar14)) {
            pMVar14 = (pointer)local_118.m_rows;
          }
          local_100 = dVar25;
          local_78 = lVar12;
          local_68._0_8_ = __s;
          local_40.m_value = lVar12;
          if (0 < (long)pMVar14) {
            memset(__s,0,(long)pMVar14 * 8);
          }
          lVar22 = IVar13 - (long)pMVar14;
          puVar15 = (undefined1 *)
                    ((long)&(pMVar14->
                            super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                            m_storage.m_data + (lVar22 - (lVar22 >> 0x3f) & 0xfffffffffffffffeU));
          if (1 < lVar22) {
            puVar10 = (undefined1 *)
                      ((long)&(pMVar14->
                              super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                              m_storage.m_data + 2);
            if ((long)puVar10 < (long)puVar15) {
              puVar10 = puVar15;
            }
            memset(&(__s->m_storage).m_data + (long)pMVar14,0,
                   ((ulong)(puVar10 + ~(ulong)pMVar14) & 0xfffffffffffffffe) * 8 + 0x10);
          }
          if (IVar13 - (long)puVar15 != 0 && (long)puVar15 <= IVar13) {
            memset(&__s[lVar22 / 2].m_storage.m_data + (long)pMVar14,0,(IVar13 - (long)puVar15) * 8)
            ;
          }
          local_128.m_storage.m_data = (double *)0x3ff0000000000000;
          Eigen::internal::
          generic_product_impl<Eigen::Inverse<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::Product<Eigen::Matrix<double,-1,-1,0,-1,-1>,Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,1,true>,0>,Eigen::DenseShape,Eigen::DenseShape,7>
          ::scaleAndAddTo<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,1,true>>
                    ((Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true> *)local_68,
                     (Inverse<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)local_b0,
                     (Product<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
                      *)(local_b0 + 8),(Scalar *)&local_128);
          dVar25 = local_100;
          lVar22 = *(long *)((long)&((local_c8.
                                      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    ).m_storage.m_cols + (long)local_100) *
                   *(long *)((long)&((local_c8.
                                      super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->
                                    super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                    ).m_storage.m_rows + (long)local_100);
          if (0 < lVar22) {
            memset(*(void **)((long)&((local_c8.
                                       super__Vector_base<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start)->
                                     super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>
                                     ).m_storage.m_data + (long)local_100),0,lVar22 * 8);
          }
          lVar12 = lVar12 + 1;
          dVar25 = (double)((long)dVar25 + 0x18);
          this = local_e8;
        } while (lVar12 < local_e8->nInvSolFound);
      }
      iVar9 = local_f4 + 1;
    } while (iVar9 < (this->param).iterMax);
  }
  if (0 < this->M) {
    piVar5 = (this->sNearestInv).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    lVar12 = 0;
    pdVar20 = local_148.m_data + local_148.m_rows;
    do {
      iVar9 = -(uint)(local_148.m_cols == 0);
      if (1 < local_148.m_cols) {
        dVar25 = local_148.m_data[lVar12];
        lVar24 = 1;
        lVar22 = 0;
        pdVar16 = pdVar20;
        do {
          dVar3 = *pdVar16;
          if (dVar25 < dVar3) {
            lVar22 = lVar24;
          }
          iVar9 = (int)lVar22;
          if (dVar3 <= dVar25) {
            dVar3 = dVar25;
          }
          dVar25 = dVar3;
          lVar24 = lVar24 + 1;
          pdVar16 = pdVar16 + local_148.m_rows;
        } while (local_148.m_cols != lVar24);
      }
      piVar5[lVar12] = iVar9;
      lVar12 = lVar12 + 1;
      pdVar20 = pdVar20 + 1;
    } while (lVar12 < this->M);
  }
  std::
  vector<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
  ::~vector(&local_c8);
  free(local_118.m_data);
  free(local_148.m_data);
  return;
}

Assistant:

IMLE_CLASS_TEMPLATE
void IMLE_base::clusterInverseSolutions(int newSol1, int newSol2, int worseSol)
{
    Mat p(M,nInvSolFound);
    Mat sol(d,nInvSolFound);
    ArrayZZ sum_invRp(nInvSolFound, zeroZZ);

    // "Educated" guesses for the nInvSolFound solutions
    for(int k = 0; k < nInvSolFound-1; k++)
        sol.col(k) = invPredictions[k];
    // Split worse solution in two
    sol.col(worseSol)    = experts[newSol1].getPredZ();
    sol.col(nInvSolFound-1) = experts[newSol2].getPredZ();

    for( int nIter = 0; nIter < param.iterMax; nIter++ )
    {
        // E-Step
        for( int j = 0; j < M; j++ )
        {
            for( int k = 0; k < nInvSolFound; k++ )
            {
                Z dist = experts[j].getPredZ() - sol.col(k);
                p(j,k) = exp(-0.5*dist.dot(iInvRj[j]*dist)/sumAll);
            }
            Scal pSum;
            if( (pSum = p.row(j).sum()) > 0.0 )
                p.row(j) /= pSum;

            for( int k = 0; k < nInvSolFound; k++ )
                sum_invRp[k] += iInvRj[j] * p(j,k);
        }
        // M-Step
        for( int k = 0; k < nInvSolFound; k++ )
        {
            /* Here I can easily implement k-means by hard assigning to most probable solution */
            sol.col(k).noalias() = sum_invRp[k].inverse() * (invRzj * p.col(k));

            // Cleaning aux variable
            sum_invRp[k].setZero();
        }
    }

    // Hard assign solutions
    for( int j = 0; j < M; j++ )
        p.row(j).maxCoeff(&sNearestInv[j]);
}